

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_int_field_Test::
PriceUpdateDecoderTest_test_decode_int_field_Test
          (PriceUpdateDecoderTest_test_decode_int_field_Test *this)

{
  PriceUpdateDecoderTest::PriceUpdateDecoderTest(&this->super_PriceUpdateDecoderTest);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_00271f68;
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_int_field)
{
    int32_t value = 483948038;
    buffer.WriteInt(value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::INTEGER, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::INTEGER, field.GetType());
    EXPECT_EQ(value, field.GetInt());
}